

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_compile_regexp(JSContext *ctx,JSValue pattern,JSValue flags)

{
  uint uVar1;
  char *pcVar2;
  uint8_t *buf;
  ulong uVar3;
  uint re_flags;
  ulong uVar5;
  size_t sVar6;
  uint uVar7;
  JSValue JVar8;
  size_t len;
  int re_bytecode_len;
  char error_msg [64];
  size_t local_78;
  int local_6c;
  char local_68 [64];
  int64_t iVar4;
  
  re_flags = 0;
  if ((int)flags.tag == 3) {
LAB_0012bbcc:
    pcVar2 = JS_ToCStringLen2(ctx,&local_78,pattern,(uint)((re_flags & 0x10) == 0));
    if (pcVar2 != (char *)0x0) {
      buf = lre_compile(&local_6c,local_68,0x40,pcVar2,local_78,re_flags,ctx);
      JS_FreeCString(ctx,pcVar2);
      if (buf != (uint8_t *)0x0) {
        JVar8 = js_new_string8(ctx,buf,local_6c);
        iVar4 = JVar8.tag;
        (*(ctx->rt->mf).js_free)(&ctx->rt->malloc_state,buf);
        uVar3 = (ulong)JVar8.u.ptr & 0xffffffff00000000;
        uVar5 = (ulong)JVar8.u.ptr & 0xffffffff;
        goto LAB_0012bca0;
      }
      JS_ThrowSyntaxError(ctx,"%s",local_68);
    }
  }
  else {
    re_flags = 0;
    pcVar2 = JS_ToCStringLen2(ctx,&local_78,flags,0);
    if (pcVar2 != (char *)0x0) {
      if (local_78 != 0) {
        re_flags = 0;
        sVar6 = 0;
        do {
          uVar1 = (byte)pcVar2[sVar6] - 0x67 >> 1;
          uVar7 = uVar1 | (uint)(((byte)pcVar2[sVar6] - 0x67 & 1) != 0) << 0x1f;
          if (((9 < uVar7) || ((0x2cbU >> (uVar1 & 0x1f) & 1) == 0)) ||
             ((*(uint *)(&DAT_00179c58 + (ulong)uVar7 * 4) & re_flags) != 0)) {
            JS_FreeCString(ctx,pcVar2);
            JS_ThrowSyntaxError(ctx,"invalid regular expression flags");
            goto LAB_0012bc9e;
          }
          re_flags = re_flags | *(uint *)(&DAT_00179c58 + (ulong)uVar7 * 4);
          sVar6 = sVar6 + 1;
        } while (local_78 != sVar6);
      }
      JS_FreeCString(ctx,pcVar2);
      goto LAB_0012bbcc;
    }
  }
LAB_0012bc9e:
  uVar5 = 0;
  iVar4 = 6;
  uVar3 = 0;
LAB_0012bca0:
  JVar8.tag = iVar4;
  JVar8.u.ptr = (void *)(uVar5 | uVar3);
  return JVar8;
}

Assistant:

static JSValue js_compile_regexp(JSContext *ctx, JSValueConst pattern,
                                 JSValueConst flags)
{
    const char *str;
    int re_flags, mask;
    uint8_t *re_bytecode_buf;
    size_t i, len;
    int re_bytecode_len;
    JSValue ret;
    char error_msg[64];

    re_flags = 0;
    if (!JS_IsUndefined(flags)) {
        str = JS_ToCStringLen(ctx, &len, flags);
        if (!str)
            return JS_EXCEPTION;
        /* XXX: re_flags = LRE_FLAG_OCTAL unless strict mode? */
        for (i = 0; i < len; i++) {
            switch(str[i]) {
            case 'g':
                mask = LRE_FLAG_GLOBAL;
                break;
            case 'i':
                mask = LRE_FLAG_IGNORECASE;
                break;
            case 'm':
                mask = LRE_FLAG_MULTILINE;
                break;
            case 's':
                mask = LRE_FLAG_DOTALL;
                break;
            case 'u':
                mask = LRE_FLAG_UTF16;
                break;
            case 'y':
                mask = LRE_FLAG_STICKY;
                break;
            default:
                goto bad_flags;
            }
            if ((re_flags & mask) != 0) {
            bad_flags:
                JS_FreeCString(ctx, str);
                return JS_ThrowSyntaxError(ctx, "invalid regular expression flags");
            }
            re_flags |= mask;
        }
        JS_FreeCString(ctx, str);
    }

    str = JS_ToCStringLen2(ctx, &len, pattern, !(re_flags & LRE_FLAG_UTF16));
    if (!str)
        return JS_EXCEPTION;
    re_bytecode_buf = lre_compile(&re_bytecode_len, error_msg,
                                  sizeof(error_msg), str, len, re_flags, ctx);
    JS_FreeCString(ctx, str);
    if (!re_bytecode_buf) {
        JS_ThrowSyntaxError(ctx, "%s", error_msg);
        return JS_EXCEPTION;
    }

    ret = js_new_string8(ctx, re_bytecode_buf, re_bytecode_len);
    js_free(ctx, re_bytecode_buf);
    return ret;
}